

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::Event::armBreadthFirst(Event *this)

{
  Event **ppEVar1;
  EventLoop *pEVar2;
  long in_FS_OFFSET;
  Fault f;
  Fault local_10;
  
  if (*(EventLoop **)(in_FS_OFFSET + -0x10) == (EventLoop *)0x0 ||
      *(EventLoop **)(in_FS_OFFSET + -0x10) == this->loop) {
    if (this->prev == (Event **)0x0) {
      ppEVar1 = this->loop->tail;
      this->next = *ppEVar1;
      this->prev = ppEVar1;
      *ppEVar1 = this;
      if (this->next != (Event *)0x0) {
        this->next->prev = &this->next;
      }
      pEVar2 = this->loop;
      pEVar2->tail = &this->next;
      if (pEVar2->lastRunnableState == false) {
        (*pEVar2->port->_vptr_EventPort[2])(pEVar2->port,1);
        pEVar2->lastRunnableState = true;
      }
    }
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[129]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x230,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
             "\"Event armed from different thread than it was created in.  You must use \" \"the thread-safe work queue to queue events cross-thread.\""
             ,(char (*) [129])
              "Event armed from different thread than it was created in.  You must use the thread-safe work queue to queue events cross-thread."
            );
  Debug::Fault::fatal(&local_10);
}

Assistant:

void Event::armBreadthFirst() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "the thread-safe work queue to queue events cross-thread.");

  if (prev == nullptr) {
    next = *loop.tail;
    prev = loop.tail;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    loop.tail = &next;

    loop.setRunnable(true);
  }
}